

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointOnCurveProjection.h
# Opt level: O2

void __thiscall
anurbs::PointOnCurveProjection<3L>::PointOnCurveProjection
          (PointOnCurveProjection<3L> *this,Pointer<CurveBaseD>_conflict *curve,double tolerance,
          double tessellation_tolerance)

{
  pointer __p;
  CurveBaseD *curve_00;
  __shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2> local_60;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  local_50;
  
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_tessellation).second.
  super__Vector_base<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_tessellation).first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>,
             &curve->super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>);
  this->m_tessellation_tolerance = tessellation_tolerance;
  this->m_tolerance = tolerance;
  (this->mapper)._M_t.
  super___uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_anurbs::PolylineMapper<3L>_*,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
  .super__Head_base<0UL,_anurbs::PolylineMapper<3L>_*,_false>._M_head_impl =
       (PolylineMapper<3L> *)0x0;
  std::__shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_60,
             &(this->m_curve).super___shared_ptr<anurbs::CurveBase<3L>,_(__gnu_cxx::_Lock_policy)2>)
  ;
  CurveTessellation<3L>::compute
            (&local_50,(CurveTessellation<3L> *)local_60._M_ptr,curve_00,
             this->m_tessellation_tolerance);
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ::operator=(&this->m_tessellation,&local_50);
  std::
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_std::allocator<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>_>_>
  ::~pair(&local_50);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60._M_refcount);
  new_<anurbs::PolylineMapper<3l>,std::vector<Eigen::Matrix<double,1,3,1,1,3>,std::allocator<Eigen::Matrix<double,1,3,1,1,3>>>&>
            ((anurbs *)&local_50,&(this->m_tessellation).second);
  __p = local_50.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start;
  local_50.first.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  std::
  __uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>::
  reset((__uniq_ptr_impl<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
         *)&this->mapper,(pointer)__p);
  std::unique_ptr<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>::
  ~unique_ptr((unique_ptr<anurbs::PolylineMapper<3L>,_std::default_delete<anurbs::PolylineMapper<3L>_>_>
               *)&local_50);
  return;
}

Assistant:

PointOnCurveProjection(Pointer<CurveBaseD> curve, const double tolerance, const double tessellation_tolerance)
        : m_tessellation()
        , m_curve(curve)
        , m_tessellation_tolerance(tessellation_tolerance)
        , m_tolerance(tolerance)
    {
        // new_ polyline
        m_tessellation = CurveTessellation<TDimension>::compute(*Curve(), m_tessellation_tolerance);
        mapper = new_<PolylineMapper<TDimension>>(m_tessellation.second);
    }